

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O2

void __thiscall senjo::UCIAdapter::GoCommand(UCIAdapter *this,char *params)

{
  bool bVar1;
  BackgroundCommand *this_00;
  Output local_50;
  string local_48 [32];
  char *params_local;
  
  params_local = params;
  this_00 = (BackgroundCommand *)operator_new(0x50);
  this_00->engine = this->engine;
  this_00->_vptr_BackgroundCommand = (_func_int **)&PTR__BackgroundCommand_00157bc0;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&params_local);
  if (bVar1) {
    Output::Output(&local_50,InfoPrefix);
    std::operator<<((ostream *)&std::cout,"usage: ");
    (*this_00->_vptr_BackgroundCommand[3])(local_48,this_00);
    std::operator<<((ostream *)&std::cout,local_48);
    std::__cxx11::string::~string(local_48);
    Output::~Output(&local_50);
    Output::Output(&local_50,InfoPrefix);
    (*this_00->_vptr_BackgroundCommand[4])(local_48,this_00);
    std::operator<<((ostream *)&std::cout,local_48);
    std::__cxx11::string::~string(local_48);
    Output::~Output(&local_50);
  }
  else {
    bVar1 = BackgroundCommand::ParseAndExecute(this_00,params_local,&this->thread);
    if (bVar1) {
      return;
    }
  }
  (*this_00->_vptr_BackgroundCommand[1])(this_00);
  return;
}

Assistant:

void UCIAdapter::GoCommand(const char* params)
{
  GoCommandHandle* handle = new GoCommandHandle(engine);
  if (!handle) {
    Output() << "Out of memory";
    return;
  }

  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << handle->Usage();
    Output() << handle->Description();
  }
  else if (handle->ParseAndExecute(params, thread)) {
    return;
  }

  delete handle;
  handle = NULL;
}